

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

substr __thiscall
c4::yml::Parser::_scan_complex_key(Parser *this,csubstr currscalar,csubstr peeked_line)

{
  code *pcVar1;
  ro_substr pattern;
  ro_substr pattern_00;
  ro_substr chars;
  ro_substr pattern_01;
  ro_substr pattern_02;
  bool bVar2;
  error_flags eVar3;
  size_t sVar4;
  char *in_RCX;
  long in_RDX;
  ulong in_RSI;
  long in_RDI;
  size_t in_R8;
  char msg_2 [44];
  size_t colpos;
  csubstr next_peeked;
  size_t pos;
  size_t offs;
  char msg_1 [50];
  char msg [43];
  substr full;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  basic_substring<const_char> *in_stack_fffffffffffffd78;
  Location *in_stack_fffffffffffffd80;
  size_t in_stack_fffffffffffffd88;
  undefined1 *puVar5;
  undefined7 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda7;
  basic_substring<const_char> *in_stack_fffffffffffffda8;
  code *in_stack_fffffffffffffdb0;
  undefined1 *in_stack_fffffffffffffdb8;
  code *in_stack_fffffffffffffdc0;
  undefined6 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdce;
  undefined1 in_stack_fffffffffffffdcf;
  undefined4 uStack_208;
  undefined4 uStack_204;
  basic_substring<const_char> *local_200;
  undefined1 local_1f8 [32];
  Parser *in_stack_fffffffffffffe28;
  size_t in_stack_fffffffffffffe38;
  Parser *in_stack_fffffffffffffe40;
  csubstr local_1b0;
  basic_substring<char_const> local_1a0 [16];
  basic_substring<char_const> local_190 [16];
  size_t local_180;
  basic_substring<char_const> local_178 [16];
  basic_substring<char_const> local_168 [16];
  ulong local_158;
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  basic_substring<const_char> *local_130;
  basic_substring<const_char> local_128 [4];
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined4 local_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  basic_substring<const_char> *local_d0;
  undefined1 local_c8 [80];
  char *local_78;
  size_t local_70;
  ulong local_68;
  long local_60;
  substr local_58;
  long *local_48;
  ulong *local_40;
  ulong *local_38;
  ulong *local_30;
  csubstr *local_28;
  ulong *local_20;
  bool local_1;
  
  local_20 = (ulong *)(in_RDI + 0x18);
  if (*(long *)(in_RDI + 0x20) == 0) {
    in_stack_fffffffffffffdce = false;
    local_1 = (bool)in_stack_fffffffffffffdce;
    if ((in_RDX == 0) &&
       (in_stack_fffffffffffffdce = false, local_1 = (bool)in_stack_fffffffffffffdce,
       in_RSI == *local_20)) {
      in_stack_fffffffffffffdce = *local_20 != 0;
      local_1 = (bool)in_stack_fffffffffffffdce;
    }
  }
  else {
    in_stack_fffffffffffffdcf = false;
    local_1 = (bool)in_stack_fffffffffffffdcf;
    if (*local_20 <= in_RSI) {
      in_stack_fffffffffffffdcf = in_RSI + in_RDX <= *local_20 + *(long *)(in_RDI + 0x20);
      local_1 = (bool)in_stack_fffffffffffffdcf;
    }
  }
  local_78 = in_RCX;
  local_70 = in_R8;
  local_68 = in_RSI;
  local_60 = in_RDX;
  if (local_1 == false) {
    memcpy(local_c8,"check failed: (m_buf.is_super(currscalar))",0x2b);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    in_stack_fffffffffffffdc0 = *(code **)(in_RDI + 0x9e8);
    in_stack_fffffffffffffdb8 = local_c8;
    Location::Location(in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78,
                       CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                       CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                       CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    (*in_stack_fffffffffffffdc0)(in_stack_fffffffffffffdb8,0x2b,*(undefined8 *)(in_RDI + 0x9d0));
    in_stack_fffffffffffffd60 = uStack_e8;
    in_stack_fffffffffffffd64 = uStack_e4;
    in_stack_fffffffffffffd68 = local_e0;
    in_stack_fffffffffffffd6c = uStack_dc;
    in_stack_fffffffffffffd70 = uStack_d8;
    in_stack_fffffffffffffd74 = uStack_d4;
    in_stack_fffffffffffffd78 = local_d0;
  }
  local_30 = &local_68;
  local_40 = (ulong *)(in_RDI + 0x18);
  if (local_68 + local_60 < *local_40) {
    memcpy(local_128,"check failed: (currscalar.end() >= m_buf.begin())",0x32);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    in_stack_fffffffffffffdb0 = *(code **)(in_RDI + 0x9e8);
    in_stack_fffffffffffffda8 = local_128;
    Location::Location(in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78,
                       CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                       CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                       CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    (*in_stack_fffffffffffffdb0)(in_stack_fffffffffffffda8,0x32,*(undefined8 *)(in_RDI + 0x9d0));
    in_stack_fffffffffffffd60 = uStack_148;
    in_stack_fffffffffffffd64 = uStack_144;
    in_stack_fffffffffffffd68 = local_140;
    in_stack_fffffffffffffd6c = uStack_13c;
    in_stack_fffffffffffffd70 = uStack_138;
    in_stack_fffffffffffffd74 = uStack_134;
    in_stack_fffffffffffffd78 = local_130;
  }
  local_38 = &local_68;
  local_48 = (long *)(in_RDI + 0x18);
  local_158 = (local_68 + local_60) - *local_48;
  do {
    basic_substring<char_const>::basic_substring<4ul>(local_168,(char (*) [4])0x33f6c8);
    pattern.len = in_stack_fffffffffffffd88;
    pattern.str = (char *)in_stack_fffffffffffffd80;
    bVar2 = basic_substring<const_char>::begins_with(in_stack_fffffffffffffd78,pattern);
    if (bVar2) {
LAB_0031376e:
      if (*(ulong *)(*(long *)(in_RDI + 0x9f0) + 0x30) < local_158) {
        memcpy(local_1f8,"check failed: (m_state->pos.offset >= offs)",0x2c);
        eVar3 = get_error_flags();
        if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          trap_instruction();
        }
        pcVar1 = *(code **)(in_RDI + 0x9e8);
        puVar5 = local_1f8;
        Location::Location(in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78,
                           CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                           CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                           CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
        (*pcVar1)(puVar5,0x2c,*(undefined8 *)(in_RDI + 0x9d0));
        in_stack_fffffffffffffd70 = uStack_208;
        in_stack_fffffffffffffd74 = uStack_204;
        in_stack_fffffffffffffd78 = local_200;
      }
      basic_substring<char>::basic_substring
                ((basic_substring<char> *)in_stack_fffffffffffffd80,
                 (char *)in_stack_fffffffffffffd78,
                 CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
      return local_58;
    }
    basic_substring<char_const>::basic_substring<4ul>(local_178,(char (*) [4])"---");
    pattern_00.len = in_stack_fffffffffffffd88;
    pattern_00.str = (char *)in_stack_fffffffffffffd80;
    bVar2 = basic_substring<const_char>::begins_with(in_stack_fffffffffffffd78,pattern_00);
    if (bVar2) goto LAB_0031376e;
    basic_substring<char_const>::basic_substring<7ul>(local_190,(char (*) [7])"?:[]{}");
    chars.len = (size_t)in_stack_fffffffffffffdb8;
    chars.str = (char *)in_stack_fffffffffffffdb0;
    local_180 = basic_substring<const_char>::first_of
                          (in_stack_fffffffffffffda8,chars,
                           CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
    if (local_180 == 0xffffffffffffffff) {
      basic_substring<char_const>::basic_substring<3ul>(local_1a0,(char (*) [3])0x359d20);
      pattern_01.len = (size_t)in_stack_fffffffffffffdb8;
      pattern_01.str = (char *)in_stack_fffffffffffffdb0;
      local_180 = basic_substring<const_char>::find
                            (in_stack_fffffffffffffda8,pattern_01,
                             CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
    }
    if (local_180 != 0xffffffffffffffff) {
      _line_progressed(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      goto LAB_0031376e;
    }
    local_1b0 = _scan_to_next_nonempty_line
                          ((Parser *)
                           CONCAT17(in_stack_fffffffffffffdcf,
                                    CONCAT16(in_stack_fffffffffffffdce,in_stack_fffffffffffffdc8)),
                           (size_t)in_stack_fffffffffffffdc0);
    local_28 = &local_1b0;
    in_stack_fffffffffffffda7 = local_1b0.len == 0 || local_1b0.str == (char *)0x0;
    if ((bool)in_stack_fffffffffffffda7) goto LAB_0031376e;
    local_78 = local_1b0.str;
    local_70 = local_1b0.len;
    basic_substring<char_const>::basic_substring<3ul>
              ((basic_substring<char_const> *)&stack0xfffffffffffffe38,(char (*) [3])0x346f63);
    pattern_02.len = (size_t)in_stack_fffffffffffffdb8;
    pattern_02.str = (char *)in_stack_fffffffffffffdb0;
    sVar4 = basic_substring<const_char>::find
                      (in_stack_fffffffffffffda8,pattern_02,
                       CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
    if (sVar4 != 0xffffffffffffffff) {
      _line_progressed(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      goto LAB_0031376e;
    }
    bVar2 = _advance_to_peeked(in_stack_fffffffffffffe28);
    if (!bVar2) goto LAB_0031376e;
    local_78 = *(char **)(*(long *)(in_RDI + 0x9f0) + 0x78);
    local_70 = *(size_t *)(*(long *)(in_RDI + 0x9f0) + 0x80);
  } while( true );
}

Assistant:

substr Parser::_scan_complex_key(csubstr currscalar, csubstr peeked_line)
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_buf.is_super(currscalar));
    // NOTE. there's a problem with _scan_to_next_nonempty_line(), as it counts newlines twice
    // size_t offs = m_state->pos.offset;   // so we workaround by directly counting from the end of the given scalar
    _RYML_CB_ASSERT(m_stack.m_callbacks, currscalar.end() >= m_buf.begin());
    size_t offs = static_cast<size_t>(currscalar.end() - m_buf.begin());
    while(true)
    {
        _c4dbgp("rcplxkey: continuing...");
        if(peeked_line.begins_with("...") || peeked_line.begins_with("---"))
        {
            _c4dbgpf("rcplxkey: document termination next -- bail now '{}'", peeked_line.trimr("\r\n"));
            break;
        }
        else
        {
            size_t pos = peeked_line.first_of("?:[]{}");
            if(pos == csubstr::npos)
            {
                pos = peeked_line.find("- ");
            }
            if(pos != csubstr::npos)
            {
                _c4dbgpf("rcplxkey: found special characters at pos={}: '{}'", pos, peeked_line.trimr("\r\n"));
                _line_progressed(pos);
                break;
            }
        }

        _c4dbgpf("rcplxkey: no special chars found '{}'", peeked_line.trimr("\r\n"));
        csubstr next_peeked = _scan_to_next_nonempty_line(0);
        if(next_peeked.empty())
        {
            _c4dbgp("rcplxkey: empty ... finished.");
            break;
        }
        _c4dbgp("rcplxkey: ... continuing.");
        peeked_line = next_peeked;

        _c4dbgpf("rcplxkey: line contents: '{}'", peeked_line.trimr("\r\n"));
        size_t colpos;
        if((colpos = peeked_line.find(": ")) != npos)
        {
            _c4dbgp("rcplxkey: found ': ', stopping.");
            _line_progressed(colpos);
            break;
        }
        #ifdef RYML_NO_COVERAGE__TO_BE_DELETED
        else if((colpos = peeked_line.ends_with(':')))
        {
            _c4dbgp("rcplxkey: ends with ':', stopping.");
            _line_progressed(colpos);
            break;
        }
        #endif
        _c4dbgpf("rcplxkey: append another line: (len={})'{}'", peeked_line.len, peeked_line.trimr("\r\n"));
        if(!_advance_to_peeked())
        {
            _c4dbgp("rcplxkey: file finishes after the scalar");
            break;
        }
        peeked_line = m_state->line_contents.rem;
    }
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->pos.offset >= offs);
    substr full(m_buf.str + (currscalar.str - m_buf.str),
                currscalar.len + (m_state->pos.offset - offs));
    return full;
}